

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O1

void qDrawPlainRect(QPainter *p,QRect *r,QColor *c,int lineWidth,QBrush *fill)

{
  int x;
  int y;
  
  x = (r->x1).m_i;
  y = (r->y1).m_i;
  qDrawPlainRect(p,x,y,((r->x2).m_i - x) + 1,((r->y2).m_i - y) + 1,c,lineWidth,fill);
  return;
}

Assistant:

void qDrawPlainRect(QPainter *p, const QRect &r, const QColor &c,
                     int lineWidth, const QBrush *fill)
{
    qDrawPlainRect(p, r.x(), r.y(), r.width(), r.height(), c,
                    lineWidth, fill);
}